

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

void __thiscall
rengine::OpenGLRenderer::drawColorFilterQuad
          (OpenGLRenderer *this,uint offset,GLuint texId,mat4 matrix)

{
  GLuint texId_local;
  uint offset_local;
  OpenGLRenderer *this_local;
  
  activateShader(this,&(this->prog_colorFilter).super_Program);
  ensureMatrixUpdated(this,UpdateColorFilterProgram,&(this->prog_colorFilter).super_Program);
  glUniformMatrix4fv((this->prog_colorFilter).colorMatrix,1,1,&matrix);
  glVertexAttribPointer(0,2,0x1406,0,0,(ulong)offset << 3);
  glBindTexture(0xde1,texId);
  glDrawArrays(5,0,4);
  return;
}

Assistant:

inline void OpenGLRenderer::drawColorFilterQuad(unsigned offset, GLuint texId, mat4 matrix)
{
    activateShader(&prog_colorFilter);
    ensureMatrixUpdated(UpdateColorFilterProgram, &prog_colorFilter);
    glUniformMatrix4fv(prog_colorFilter.colorMatrix, 1, true, matrix.m);
    // std::cout << prog_colorFilter.colorMatrix << matrix;
    glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, (void *) (offset * sizeof(vec2)));
    glBindTexture(GL_TEXTURE_2D, texId);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
}